

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

DescriptorMap *
Memory::
AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
          (Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  DescriptorMap *pDVar5;
  DescriptorMap *pDVar6;
  
  if (AllocFunc == 0) {
    Recycler::ClearTrackAllocInfo(allocator,(TrackAllocData *)0x0);
    pDVar5 = (DescriptorMap *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00ce55c0;
      *puVar4 = 0;
    }
    pDVar5 = (DescriptorMap *)
             Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (allocator,-(ulong)(AllocFunc >> 0x3a != 0) | AllocFunc * 0x40);
    if (pDVar5 == (DescriptorMap *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00ce55c0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pDVar6 = pDVar5;
    do {
      (pDVar6->propRecord).ptr = (PropertyRecord *)0x0;
      Js::PropertyDescriptor::PropertyDescriptor(&pDVar6->descriptor);
      (pDVar6->originalVar).ptr = (void *)0x0;
      pDVar6 = pDVar6 + 1;
    } while (pDVar6 != pDVar5 + AllocFunc);
  }
  return pDVar5;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}